

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyParserColorStopList.cpp
# Opt level: O3

void __thiscall
Rml::PropertyParserColorStopList::PropertyParserColorStopList
          (PropertyParserColorStopList *this,PropertyParser *parser_color)

{
  code *pcVar1;
  bool bVar2;
  
  (this->super_PropertyParser)._vptr_PropertyParser =
       (_func_int **)&PTR__PropertyParserColorStopList_00331068;
  this->parser_color = parser_color;
  PropertyParserNumber::PropertyParserNumber
            (&this->parser_length_percent_angle,ANGLE|LENGTH_PERCENT,PERCENT);
  if (parser_color == (PropertyParser *)0x0) {
    bVar2 = Assert("RMLUI_ASSERT(parser_color)",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/PropertyParserColorStopList.cpp"
                   ,0x27);
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  return;
}

Assistant:

PropertyParserColorStopList::PropertyParserColorStopList(PropertyParser* parser_color) :
	parser_color(parser_color), parser_length_percent_angle(Unit::LENGTH_PERCENT | Unit::ANGLE, Unit::PERCENT)
{
	RMLUI_ASSERT(parser_color);
}